

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bformatdec.cpp
# Opt level: O0

unique_ptr<BFormatDec,_std::default_delete<BFormatDec>_>
BFormatDec::Create(AmbDecConf *conf,bool allow_2band,size_t inchans,ALuint srate,
                  ALuint (*chanmap) [16],
                  unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *stablizer)

{
  byte in_DL;
  _Head_base<0UL,_BFormatDec_*,_false> in_RDI;
  ALuint (*in_stack_00000068) [16];
  ALuint in_stack_00000074;
  size_t in_stack_00000078;
  undefined1 in_stack_00000087;
  undefined4 in_stack_00000090;
  undefined7 in_stack_000000a0;
  unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *in_stack_ffffffffffffff48;
  pointer __p;
  unique_ptr<BFormatDec,_std::default_delete<BFormatDec>_> *in_stack_ffffffffffffff50;
  byte local_11;
  
  local_11 = in_DL & 1;
  operator_new((size_t)in_RDI._M_head_impl,(FamCount)in_RDI._M_head_impl);
  __p = (pointer)&stack0xffffffffffffffc8;
  std::unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_>::unique_ptr
            ((unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *)
             in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  BFormatDec((BFormatDec *)CONCAT44(srate,in_stack_00000090),(AmbDecConf *)chanmap,
             (bool)in_stack_00000087,in_stack_00000078,in_stack_00000074,in_stack_00000068,
             (unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *)
             CONCAT17(allow_2band,in_stack_000000a0));
  std::unique_ptr<BFormatDec,std::default_delete<BFormatDec>>::
  unique_ptr<std::default_delete<BFormatDec>,void>(in_stack_ffffffffffffff50,__p);
  std::unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_>::~unique_ptr
            ((unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *)in_RDI._M_head_impl
            );
  return (__uniq_ptr_data<BFormatDec,_std::default_delete<BFormatDec>,_true,_true>)
         (tuple<BFormatDec_*,_std::default_delete<BFormatDec>_>)in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<BFormatDec> BFormatDec::Create(const AmbDecConf *conf, const bool allow_2band,
    const size_t inchans, const ALuint srate, const ALuint (&chanmap)[MAX_OUTPUT_CHANNELS],
    std::unique_ptr<FrontStablizer> stablizer)
{
    return std::unique_ptr<BFormatDec>{new(FamCount(inchans))
        BFormatDec{conf, allow_2band, inchans, srate, chanmap, std::move(stablizer)}};
}